

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

ECDSA_SIG * gost_ec_sign(uchar *dgst,int dlen,EC_KEY *eckey)

{
  int iVar1;
  BN_CTX *ctx_00;
  BIGNUM *m;
  ECDSA_SIG *sig;
  EC_GROUP *group_00;
  BIGNUM *pBVar2;
  BIGNUM *a;
  BIGNUM *rem;
  BIGNUM *rnd;
  EC_KEY *in_RDX;
  int in_ESI;
  long in_RDI;
  BN_CTX *ctx;
  EC_POINT *C;
  BIGNUM *new_s;
  BIGNUM *new_r;
  BIGNUM *e;
  BIGNUM *k;
  BIGNUM *tmp2;
  BIGNUM *tmp;
  BIGNUM *X;
  BIGNUM *s;
  BIGNUM *r;
  BIGNUM *priv_key;
  EC_GROUP *group;
  BIGNUM *order;
  BIGNUM *md;
  ECDSA_SIG *ret;
  ECDSA_SIG *newsig;
  EC_POINT *ctx_01;
  BIGNUM *m_00;
  EC_POINT *q;
  BIGNUM *pBVar3;
  BIGNUM *local_70;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  ECDSA_SIG *local_30;
  ECDSA_SIG *local_8;
  
  local_30 = (ECDSA_SIG *)0x0;
  local_58 = (BIGNUM *)0x0;
  local_60 = (BIGNUM *)0x0;
  local_68 = (BIGNUM *)0x0;
  local_70 = (BIGNUM *)0x0;
  pBVar3 = (BIGNUM *)0x0;
  q = (EC_POINT *)0x0;
  m_00 = (BIGNUM *)0x0;
  ctx_01 = (EC_POINT *)0x0;
  if ((in_RDI == 0) || (in_RDX == (EC_KEY *)0x0)) {
    OPENSSL_die("assertion failed: dgst != NULL && eckey != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                ,0xc5);
  }
  ctx_00 = (BN_CTX *)BN_CTX_secure_new();
  if (ctx_00 == (BN_CTX *)0x0) {
    ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)0x0,0);
    local_8 = (ECDSA_SIG *)0x0;
  }
  else {
    BN_CTX_start(ctx_00);
    if ((in_ESI != 0x20) && (in_ESI != 0x40)) {
      OPENSSL_die("assertion failed: dlen == 32 || dlen == 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                  ,0xcd);
    }
    m = (BIGNUM *)BN_lebin2bn(in_RDI,in_ESI,0);
    sig = ECDSA_SIG_new();
    if ((sig == (ECDSA_SIG *)0x0) || (m == (BIGNUM *)0x0)) {
      ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
    }
    else {
      group_00 = EC_KEY_get0_group(in_RDX);
      if (group_00 == (EC_GROUP *)0x0) {
        ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
      }
      else {
        pBVar2 = BN_CTX_get(ctx_00);
        if ((pBVar2 == (BIGNUM *)0x0) ||
           (iVar1 = EC_GROUP_get_order(group_00,pBVar2,ctx_00), iVar1 == 0)) {
          ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
        }
        else {
          a = EC_KEY_get0_private_key(in_RDX);
          if (a == (BIGNUM *)0x0) {
            ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
          }
          else {
            rem = BN_CTX_get(ctx_00);
            if ((rem == (BIGNUM *)0x0) ||
               (iVar1 = BN_div((BIGNUM *)0x0,rem,m,pBVar2,ctx_00), iVar1 == 0)) {
              ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
            }
            else {
              iVar1 = BN_is_zero(rem);
              if (iVar1 != 0) {
                BN_set_word(rem,1);
              }
              rnd = BN_CTX_get(ctx_00);
              ctx_01 = EC_POINT_new(group_00);
              if ((rnd == (BIGNUM *)0x0) || (ctx_01 == (EC_POINT *)0x0)) {
                ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
              }
              else {
                do {
                  do {
                    iVar1 = BN_rand_range(rnd,pBVar2);
                    if (iVar1 == 0) {
                      ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                      goto LAB_00131692;
                    }
                    iVar1 = gost_ec_point_mul((EC_GROUP *)pBVar3,(EC_POINT *)rnd,(BIGNUM *)rem,q,
                                              m_00,(BN_CTX *)ctx_01);
                    if (iVar1 == 0) {
                      ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                      goto LAB_00131692;
                    }
                    if (local_68 == (BIGNUM *)0x0) {
                      local_68 = BN_CTX_get(ctx_00);
                    }
                    if (local_58 == (BIGNUM *)0x0) {
                      local_58 = BN_CTX_get(ctx_00);
                    }
                    if ((local_68 == (BIGNUM *)0x0) || (local_58 == (BIGNUM *)0x0)) {
                      ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                      goto LAB_00131692;
                    }
                    iVar1 = EC_POINT_get_affine_coordinates(group_00,ctx_01,local_68,0,ctx_00);
                    if (iVar1 == 0) {
                      ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                      goto LAB_00131692;
                    }
                    iVar1 = BN_nnmod(local_58,local_68,pBVar2,ctx_00);
                    if (iVar1 == 0) {
                      ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                      goto LAB_00131692;
                    }
                    iVar1 = BN_is_zero(local_58);
                  } while (iVar1 != 0);
                  if (local_70 == (BIGNUM *)0x0) {
                    local_70 = BN_CTX_get(ctx_00);
                  }
                  if (pBVar3 == (BIGNUM *)0x0) {
                    pBVar3 = BN_CTX_get(ctx_00);
                  }
                  if (local_60 == (BIGNUM *)0x0) {
                    local_60 = BN_CTX_get(ctx_00);
                  }
                  if (((local_70 == (BIGNUM *)0x0) || (pBVar3 == (BIGNUM *)0x0)) ||
                     (local_60 == (BIGNUM *)0x0)) {
                    ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                    goto LAB_00131692;
                  }
                  iVar1 = BN_mod_mul(local_70,a,local_58,pBVar2,ctx_00);
                  if (((iVar1 == 0) ||
                      (iVar1 = BN_mod_mul(pBVar3,rnd,rem,pBVar2,ctx_00), iVar1 == 0)) ||
                     (iVar1 = BN_mod_add(local_60,local_70,pBVar3,pBVar2,ctx_00), iVar1 == 0)) {
                    ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                    goto LAB_00131692;
                  }
                  iVar1 = BN_is_zero(local_60);
                } while (iVar1 != 0);
                pBVar3 = BN_dup(local_60);
                pBVar2 = BN_dup(local_58);
                if ((pBVar3 == (BIGNUM *)0x0) || (pBVar2 == (BIGNUM *)0x0)) {
                  ERR_GOST_error((int)((ulong)ctx_01 >> 0x20),(int)ctx_01,(char *)ctx_00,0);
                }
                else {
                  ECDSA_SIG_set0(sig,pBVar2,pBVar3);
                  local_30 = sig;
                }
              }
            }
          }
        }
      }
    }
LAB_00131692:
    BN_CTX_end(ctx_00);
    BN_CTX_free(ctx_00);
    if (ctx_01 != (EC_POINT *)0x0) {
      EC_POINT_free(ctx_01);
    }
    if (m != (BIGNUM *)0x0) {
      BN_free(m);
    }
    if ((local_30 == (ECDSA_SIG *)0x0) && (sig != (ECDSA_SIG *)0x0)) {
      ECDSA_SIG_free(sig);
    }
    local_8 = local_30;
  }
  return (ECDSA_SIG *)local_8;
}

Assistant:

ECDSA_SIG *gost_ec_sign(const unsigned char *dgst, int dlen, EC_KEY *eckey)
{
    ECDSA_SIG *newsig = NULL, *ret = NULL;
    BIGNUM *md = NULL;
    BIGNUM *order = NULL;
    const EC_GROUP *group;
    const BIGNUM *priv_key;
    BIGNUM *r = NULL, *s = NULL, *X = NULL, *tmp = NULL, *tmp2 = NULL,
        *k = NULL, *e = NULL;

    BIGNUM *new_r = NULL, *new_s = NULL;

    EC_POINT *C = NULL;
    BN_CTX *ctx;

    OPENSSL_assert(dgst != NULL && eckey != NULL);

    if (!(ctx = BN_CTX_secure_new())) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    BN_CTX_start(ctx);
    OPENSSL_assert(dlen == 32 || dlen == 64);
    md = BN_lebin2bn(dgst, dlen, NULL);
    newsig = ECDSA_SIG_new();
    if (!newsig || !md) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    group = EC_KEY_get0_group(eckey);
    if (!group) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    order = BN_CTX_get(ctx);
    if (!order || !EC_GROUP_get_order(group, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    priv_key = EC_KEY_get0_private_key(eckey);
    if (!priv_key) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    e = BN_CTX_get(ctx);
    if (!e || !BN_mod(e, md, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "digest as bignum=");
    BN_print_fp(stderr, md);
    fprintf(stderr, "\ndigest mod q=");
    BN_print_fp(stderr, e);
    fprintf(stderr, "\n");
#endif
    if (BN_is_zero(e)) {
        BN_one(e);
    }
    k = BN_CTX_get(ctx);
    C = EC_POINT_new(group);
    if (!k || !C) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    do {
        do {
            if (!BN_rand_range(k, order)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, GOST_R_RNG_ERROR);
                goto err;
            }
            if (!gost_ec_point_mul(group, C, k, NULL, NULL, ctx)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_EC_LIB);
                goto err;
            }
            if (!X)
                X = BN_CTX_get(ctx);
            if (!r)
                r = BN_CTX_get(ctx);
            if (!X || !r) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
                goto err;
            }
            if (!EC_POINT_get_affine_coordinates(group, C, X, NULL, ctx)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_EC_LIB);
                goto err;
            }

            if (!BN_nnmod(r, X, order, ctx)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
                goto err;
            }
        }
        while (BN_is_zero(r));
        /* s =  (r*priv_key+k*e) mod order */
        if (!tmp)
            tmp = BN_CTX_get(ctx);
        if (!tmp2)
            tmp2 = BN_CTX_get(ctx);
        if (!s)
            s = BN_CTX_get(ctx);
        if (!tmp || !tmp2 || !s) {
            GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
            goto err;
        }

        if (!BN_mod_mul(tmp, priv_key, r, order, ctx)
            || !BN_mod_mul(tmp2, k, e, order, ctx)
            || !BN_mod_add(s, tmp, tmp2, order, ctx)) {
            GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
            goto err;
        }
    }
    while (BN_is_zero(s));

    new_s = BN_dup(s);
    new_r = BN_dup(r);
    if (!new_s || !new_r) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    ECDSA_SIG_set0(newsig, new_r, new_s);

    ret = newsig;
 err:
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    if (C)
        EC_POINT_free(C);
    if (md)
        BN_free(md);
    if (!ret && newsig) {
        ECDSA_SIG_free(newsig);
    }
    return ret;
}